

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

CURLcode rtsp_filter_rtp(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  anon_union_280_10_9f9d5394_for_proto *s;
  byte bVar1;
  connectdata *pcVar2;
  long lVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  size_t sVar9;
  char *pcVar10;
  void **ppvVar11;
  size_t sVar12;
  curl_write_callback p_Var13;
  size_t __n;
  ulong uVar14;
  char *fmt;
  ulong uVar15;
  byte *pbVar16;
  size_t local_60;
  
  pcVar2 = data->conn;
  s = &pcVar2->proto;
  *pconsumed = 0;
  local_60 = 0;
  CVar8 = CURLE_OK;
  do {
    pbVar16 = (byte *)buf;
    if (blen == 0) goto LAB_0014ed1e;
    bVar5 = true;
    if ((((data->req).headerline != 0) && ((*(byte *)((long)&pcVar2->proto + 0x34) & 1) == 0)) &&
       (lVar3 = (data->req).size, -1 < lVar3)) {
      bVar5 = lVar3 <= (data->req).bytecount;
    }
    uVar15 = blen;
    switch((pcVar2->proto).rtspc.state) {
    case RTP_PARSE_SKIP:
      pbVar16 = (byte *)buf + blen;
      uVar14 = 0;
      do {
        if (((byte *)buf)[uVar14] == 0x24) {
          local_60 = local_60 + uVar14;
          if (local_60 == 0) {
LAB_0014ec7c:
            CVar7 = Curl_dyn_addn((dynbuf *)&s->ftpc,(byte *)buf + uVar14,1);
            if (CVar7 == CURLE_OK) {
              *pconsumed = *pconsumed + 1;
              pbVar16 = (byte *)buf + uVar14 + 1;
              uVar15 = blen + ~uVar14;
              (pcVar2->proto).rtspc.state = RTP_PARSE_CHANNEL;
              local_60 = 0;
              goto LAB_0014ec5f;
            }
            CVar8 = CURLE_OUT_OF_MEMORY;
          }
          else {
            CVar8 = rtp_write_body_junk(data,(char *)((byte *)buf + uVar14 + -local_60),local_60);
            if (CVar8 == CURLE_OK) {
              CVar8 = CURLE_OK;
              goto LAB_0014ec7c;
            }
          }
          local_60 = 0;
LAB_0014ecc0:
          pbVar16 = (byte *)buf + uVar14;
          iVar6 = 0xb;
          goto LAB_0014ec65;
        }
        if ((!(bool)(((byte *)buf)[uVar14] != 0x52 | bVar5 ^ 1U)) &&
           ((data->set).rtspreq != RTSPREQ_RECEIVE)) {
          __n = 5;
          if (uVar15 < 5) {
            __n = uVar15;
          }
          iVar6 = strncmp((char *)((byte *)buf + uVar14),"RTSP/",__n);
          if (iVar6 == 0) {
            (pcVar2->proto).rtspc.state = RTP_PARSE_SKIP;
            pbVar16 = (byte *)((long)&pcVar2->proto + 0x34);
            *pbVar16 = *pbVar16 | 1;
            local_60 = local_60 + uVar14;
            goto LAB_0014ecc0;
          }
        }
        *pconsumed = *pconsumed + 1;
        uVar15 = uVar15 - 1;
        uVar14 = uVar14 + 1;
      } while (blen != uVar14);
      uVar15 = 0;
      local_60 = local_60 + blen;
LAB_0014ec5f:
      iVar6 = 0;
      break;
    case RTP_PARSE_CHANNEL:
      bVar1 = *buf;
      if (((data->state).rtp_channel_mask[bVar1 >> 3] >> (bVar1 & 7) & 1) == 0) {
        (pcVar2->proto).rtspc.state = RTP_PARSE_SKIP;
        sVar9 = 1;
        if (*pconsumed == 0) {
          pcVar10 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
          CVar8 = rtp_write_body_junk(data,pcVar10,1);
          if (CVar8 != CURLE_OK) {
            iVar6 = 0xb;
            bVar5 = false;
            goto LAB_0014ec04;
          }
          CVar8 = CURLE_OK;
          sVar9 = local_60;
        }
        Curl_dyn_free((dynbuf *)&s->ftpc);
        iVar6 = 4;
        bVar5 = true;
        local_60 = sVar9;
      }
      else {
        *(uint *)((long)&pcVar2->proto + 0x20) = (uint)bVar1;
        CVar7 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,1);
        if (CVar7 == CURLE_OK) {
          *pconsumed = *pconsumed + 1;
          (pcVar2->proto).rtspc.state = RTP_PARSE_LEN;
          iVar6 = 4;
          bVar5 = true;
          pbVar16 = (byte *)buf + 1;
          uVar15 = blen - 1;
        }
        else {
          CVar8 = CURLE_OUT_OF_MEMORY;
          iVar6 = 0xb;
          bVar5 = false;
        }
      }
LAB_0014ec04:
      if (bVar5) goto LAB_0014ec5f;
      break;
    case RTP_PARSE_LEN:
      sVar9 = Curl_dyn_len((dynbuf *)&s->ftpc);
      CVar7 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,1);
      if (CVar7 == CURLE_OK) {
        *pconsumed = *pconsumed + 1;
        pbVar16 = (byte *)buf + 1;
        uVar15 = blen - 1;
        iVar6 = 4;
        if (sVar9 != 2) {
          pcVar10 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
          (pcVar2->proto).ftpc.pp.response.tv_sec =
               (ulong)(ushort)(*(ushort *)(pcVar10 + 2) << 8 | *(ushort *)(pcVar10 + 2) >> 8) + 4;
          (pcVar2->proto).rtspc.state = RTP_PARSE_DATA;
        }
      }
      else {
        CVar8 = CURLE_OUT_OF_MEMORY;
        iVar6 = 0xb;
      }
      if (CVar7 == CURLE_OK) goto LAB_0014ec5f;
      break;
    case RTP_PARSE_DATA:
      sVar9 = Curl_dyn_len((dynbuf *)&s->ftpc);
      uVar14 = (pcVar2->proto).ftpc.pp.response.tv_sec - sVar9;
      uVar15 = blen - uVar14;
      if (blen < uVar14) {
        CVar7 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,blen);
        if (CVar7 == CURLE_OK) {
          *pconsumed = *pconsumed + blen;
          iVar6 = 4;
          bVar5 = true;
          pbVar16 = (byte *)buf + blen;
          uVar15 = 0;
        }
        else {
          CVar8 = CURLE_OUT_OF_MEMORY;
          iVar6 = 0xb;
          bVar5 = false;
          uVar15 = blen;
        }
      }
      else {
        CVar8 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,uVar14);
        iVar6 = 0xb;
        if (CVar8 == CURLE_OK) {
          *pconsumed = *pconsumed + uVar14;
          pcVar10 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
          sVar9 = (pcVar2->proto).ftpc.pp.response.tv_sec;
          fmt = "Cannot write a 0 size RTP packet.";
          if (sVar9 == 0) {
LAB_0014eb7d:
            bVar5 = false;
            Curl_failf(data,fmt);
            CVar8 = CURLE_WRITE_ERROR;
          }
          else {
            p_Var13 = (data->set).fwrite_rtp;
            ppvVar11 = &(data->set).rtp_out;
            if (p_Var13 == (curl_write_callback)0x0) {
              p_Var13 = (data->set).fwrite_func;
              ppvVar11 = &(data->set).out;
            }
            pvVar4 = *ppvVar11;
            Curl_set_in_callback(data,true);
            sVar12 = (*p_Var13)(pcVar10,1,sVar9,pvVar4);
            Curl_set_in_callback(data,false);
            fmt = "Cannot pause RTP";
            if ((sVar12 == 0x10000001) || (fmt = "Failed writing RTP data", sVar12 != sVar9))
            goto LAB_0014eb7d;
            CVar8 = CURLE_OK;
            bVar5 = true;
          }
          pbVar16 = (byte *)buf + uVar14;
          Curl_dyn_free((dynbuf *)&s->ftpc);
          (pcVar2->proto).rtspc.state = RTP_PARSE_SKIP;
          if (bVar5) {
            CVar8 = CURLE_OK;
            iVar6 = 4;
          }
        }
        else {
          CVar8 = CURLE_OUT_OF_MEMORY;
          bVar5 = false;
          uVar15 = blen;
          iVar6 = 0xb;
        }
      }
      if (bVar5) goto LAB_0014ec5f;
      break;
    default:
      iVar6 = 1;
    }
LAB_0014ec65:
    buf = (char *)pbVar16;
    blen = uVar15;
  } while (iVar6 == 0);
  if (iVar6 == 0xb) {
LAB_0014ed1e:
    if ((CVar8 == CURLE_OK) && (local_60 != 0)) {
      CVar8 = rtp_write_body_junk(data,(char *)(pbVar16 + -local_60),local_60);
      return CVar8;
    }
  }
  else {
    CVar8 = CURLE_RECV_ERROR;
  }
  return CVar8;
}

Assistant:

static CURLcode rtsp_filter_rtp(struct Curl_easy *data,
                                     const char *buf,
                                     size_t blen,
                                     size_t *pconsumed)
{
  struct rtsp_conn *rtspc = &(data->conn->proto.rtspc);
  CURLcode result = CURLE_OK;
  size_t skip_len = 0;

  *pconsumed = 0;
  while(blen) {
    bool in_body = (data->req.headerline && !rtspc->in_header) &&
                   (data->req.size >= 0) &&
                   (data->req.bytecount < data->req.size);
    switch(rtspc->state) {

    case RTP_PARSE_SKIP: {
      DEBUGASSERT(Curl_dyn_len(&rtspc->buf) == 0);
      while(blen && buf[0] != '$') {
        if(!in_body && buf[0] == 'R' &&
           data->set.rtspreq != RTSPREQ_RECEIVE) {
          if(strncmp(buf, "RTSP/", (blen < 5) ? blen : 5) == 0) {
            /* This could be the next response, no consume and return */
            if(*pconsumed) {
              DEBUGF(infof(data, "RTP rtsp_filter_rtp[SKIP] RTSP/ prefix, "
                           "skipping %zd bytes of junk", *pconsumed));
            }
            rtspc->state = RTP_PARSE_SKIP;
            rtspc->in_header = TRUE;
            goto out;
          }
        }
        /* junk/BODY, consume without buffering */
        *pconsumed += 1;
        ++buf;
        --blen;
        ++skip_len;
      }
      if(blen && buf[0] == '$') {
        /* possible start of an RTP message, buffer */
        if(skip_len) {
          /* end of junk/BODY bytes, flush */
          result = rtp_write_body_junk(data,
                                       (char *)(buf - skip_len), skip_len);
          skip_len = 0;
          if(result)
            goto out;
        }
        if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += 1;
        ++buf;
        --blen;
        rtspc->state = RTP_PARSE_CHANNEL;
      }
      break;
    }

    case RTP_PARSE_CHANNEL: {
      int idx = ((unsigned char)buf[0]) / 8;
      int off = ((unsigned char)buf[0]) % 8;
      DEBUGASSERT(Curl_dyn_len(&rtspc->buf) == 1);
      if(!(data->state.rtp_channel_mask[idx] & (1 << off))) {
        /* invalid channel number, junk or BODY data */
        rtspc->state = RTP_PARSE_SKIP;
        DEBUGASSERT(skip_len == 0);
        /* we do not consume this byte, it is BODY data */
        DEBUGF(infof(data, "RTSP: invalid RTP channel %d, skipping", idx));
        if(*pconsumed == 0) {
          /* We did not consume the initial '$' in our buffer, but had
           * it from an earlier call. We cannot un-consume it and have
           * to write it directly as BODY data */
          result = rtp_write_body_junk(data, Curl_dyn_ptr(&rtspc->buf), 1);
          if(result)
            goto out;
        }
        else {
          /* count the '$' as skip and continue */
          skip_len = 1;
        }
        Curl_dyn_free(&rtspc->buf);
        break;
      }
      /* a valid channel, so we expect this to be a real RTP message */
      rtspc->rtp_channel = (unsigned char)buf[0];
      if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      *pconsumed += 1;
      ++buf;
      --blen;
      rtspc->state = RTP_PARSE_LEN;
      break;
    }

    case RTP_PARSE_LEN: {
      size_t rtp_len = Curl_dyn_len(&rtspc->buf);
      const char *rtp_buf;
      DEBUGASSERT(rtp_len >= 2 && rtp_len < 4);
      if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      *pconsumed += 1;
      ++buf;
      --blen;
      if(rtp_len == 2)
        break;
      rtp_buf = Curl_dyn_ptr(&rtspc->buf);
      rtspc->rtp_len = RTP_PKT_LENGTH(rtp_buf) + 4;
      rtspc->state = RTP_PARSE_DATA;
      break;
    }

    case RTP_PARSE_DATA: {
      size_t rtp_len = Curl_dyn_len(&rtspc->buf);
      size_t needed;
      DEBUGASSERT(rtp_len < rtspc->rtp_len);
      needed = rtspc->rtp_len - rtp_len;
      if(needed <= blen) {
        if(Curl_dyn_addn(&rtspc->buf, buf, needed)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += needed;
        buf += needed;
        blen -= needed;
        /* complete RTP message in buffer */
        DEBUGF(infof(data, "RTP write channel %d rtp_len %zu",
                     rtspc->rtp_channel, rtspc->rtp_len));
        result = rtp_client_write(data, Curl_dyn_ptr(&rtspc->buf),
                                  rtspc->rtp_len);
        Curl_dyn_free(&rtspc->buf);
        rtspc->state = RTP_PARSE_SKIP;
        if(result)
          goto out;
      }
      else {
        if(Curl_dyn_addn(&rtspc->buf, buf, blen)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += blen;
        buf += blen;
        blen = 0;
      }
      break;
    }

    default:
      DEBUGASSERT(0);
      return CURLE_RECV_ERROR;
    }
  }
out:
  if(!result && skip_len)
    result = rtp_write_body_junk(data, (char *)(buf - skip_len), skip_len);
  return result;
}